

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

uint64_t un_ft_offset(stagewise_poly *poly,uint64_t idx)

{
  ulong uVar1;
  vw *pvVar2;
  uint32_t *puVar3;
  uint64_t uVar4;
  
  uVar1 = (poly->synth_ec).super_example_predict.ft_offset;
  if (uVar1 != 0) {
    pvVar2 = poly->all;
    for (uVar4 = idx; idx = uVar4 - uVar1, uVar4 < uVar1;
        uVar4 = uVar4 + ((1L << ((byte)pvVar2->num_bits & 0x3f)) << ((byte)*puVar3 & 0x3f))) {
      puVar3 = &(pvVar2->weights).sparse_weights._stride_shift;
      if ((pvVar2->weights).sparse == false) {
        puVar3 = &(pvVar2->weights).dense_weights._stride_shift;
      }
    }
  }
  return idx;
}

Assistant:

inline uint64_t un_ft_offset(const stagewise_poly &poly, uint64_t idx)
{
  assert(!poly.original_ec || poly.synth_ec.ft_offset == poly.original_ec->ft_offset);
  if (poly.synth_ec.ft_offset == 0)
    return idx;
  else
  {
    while (idx < poly.synth_ec.ft_offset)
    {
      idx += poly.all->length() << poly.all->weights.stride_shift();
    }
    return idx - poly.synth_ec.ft_offset;
  }
}